

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_sockfd.c
# Opt level: O2

void sfd_dowrite(nni_sfd_conn *c)

{
  int __fd;
  void *pvVar1;
  nni_iov *pnVar2;
  nng_err result;
  nni_aio *aio;
  ulong uVar3;
  ssize_t sVar4;
  size_t count;
  int *piVar5;
  int __count;
  long lVar6;
  undefined1 local_148 [8];
  iovec iovec [16];
  nni_iov *local_40;
  nni_iov *aiov;
  uint naiov;
  
  if (c->closed == false) {
    __fd = c->fd;
    do {
      while( true ) {
        while( true ) {
          aio = (nni_aio *)nni_list_first(&c->writeq);
          if (aio == (nni_aio *)0x0) {
            return;
          }
          nni_aio_get_iov(aio,(uint *)((long)&aiov + 4),&local_40);
          pnVar2 = local_40;
          uVar3 = (ulong)aiov._4_4_;
          if (uVar3 < 0x11) break;
          nni_aio_list_remove(aio);
          nni_aio_finish_error(aio,NNG_EINVAL);
        }
        __count = 0;
        for (lVar6 = 0; uVar3 << 4 != lVar6; lVar6 = lVar6 + 0x10) {
          pvVar1 = *(void **)((long)&pnVar2->iov_len + lVar6);
          if (pvVar1 != (void *)0x0) {
            iovec[__count].iov_base = pvVar1;
            iovec[(long)__count + -1].iov_len = *(size_t *)((long)&pnVar2->iov_buf + lVar6);
            __count = __count + 1;
          }
        }
        sVar4 = writev(__fd,(iovec *)local_148,__count);
        if ((int)(uint)sVar4 < 0) break;
        nni_aio_bump_count(aio,(ulong)((uint)sVar4 & 0x7fffffff));
        nni_aio_list_remove(aio);
        count = nni_aio_count(aio);
        nni_aio_finish(aio,NNG_OK,count);
      }
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    if (*piVar5 != 0xb) {
      nni_aio_list_remove(aio);
      result = nni_plat_errno(*piVar5);
      nni_aio_finish_error(aio,result);
    }
  }
  return;
}

Assistant:

static void
sfd_dowrite(nni_sfd_conn *c)
{
	nni_aio *aio;
	int      fd = c->fd;

	if (c->closed) {
		return;
	}

	while ((aio = nni_list_first(&c->writeq)) != NULL) {
		unsigned     i;
		int          n;
		int          niov;
		unsigned     naiov;
		nni_iov     *aiov;
		struct iovec iovec[16];

		nni_aio_get_iov(aio, &naiov, &aiov);

		if (naiov > NNI_NUM_ELEMENTS(iovec)) {
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, NNG_EINVAL);
			continue;
		}

		for (niov = 0, i = 0; i < naiov; i++) {
			if (aiov[i].iov_len > 0) {
				iovec[niov].iov_len  = aiov[i].iov_len;
				iovec[niov].iov_base = aiov[i].iov_buf;
				niov++;
			}
		}

		if ((n = writev(fd, iovec, niov)) < 0) {
			switch (errno) {
			case EINTR:
				continue;
			case EAGAIN:
#ifdef EWOULDBLOCK
#if EWOULDBLOCK != EAGAIN
			case EWOULDBLOCK:
#endif
#endif
				return;
			default:
				nni_aio_list_remove(aio);
				nni_aio_finish_error(
				    aio, nni_plat_errno(errno));
				return;
			}
		}

		// If we didn't send all the data, the caller will
		// resubmit.  As a corollary, callers should probably
		// only have one message on the write queue at a time.
		nni_aio_bump_count(aio, n);
		nni_aio_list_remove(aio);
		nni_aio_finish(aio, 0, nni_aio_count(aio));

		// Go back to start of loop to see if there is another
		// aio ready for us to process.
	}
}